

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

int __thiscall
TPZFMatrix<long_double>::Substitution
          (TPZFMatrix<long_double> *this,TPZFMatrix<long_double> *B,TPZVec<int> *index)

{
  char cVar1;
  long size;
  bool bVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  ostream *poVar8;
  long *plVar9;
  long lVar10;
  long lVar11;
  char *pcVar12;
  long lVar13;
  long lVar14;
  longdouble in_ST0;
  longdouble lVar15;
  longdouble in_ST1;
  longdouble lVar16;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  TPZVec<long_double> v;
  longdouble local_ac;
  long local_a0;
  TPZVec<long_double> local_88;
  TPZFMatrix<long_double> *local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  longdouble local_3c;
  
  if (B == (TPZFMatrix<long_double> *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "virtual int TPZFMatrix<long double>::Substitution(TPZFMatrix<TVar> *, const TPZVec<int> &) const [TVar = long double]"
               ,0x75);
    pcVar12 = "TPZFMatrix<>*B eh nulo";
LAB_00be1d48:
    plVar9 = &std::cerr;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar12,0x16);
  }
  else {
    cVar1 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fDecomposed;
    if (cVar1 != '\x02') {
      if (cVar1 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "virtual int TPZFMatrix<long double>::Substitution(TPZFMatrix<TVar> *, const TPZVec<int> &) const [TVar = long double]"
                   ,0x75);
        pcVar12 = anon_var_dwarf_3563d0;
        goto LAB_00be1d48;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "virtual int TPZFMatrix<long double>::Substitution(TPZFMatrix<TVar> *, const TPZVec<int> &) const [TVar = long double]"
                 ,0x75);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\nfDecomposed != ELUPivot",0x18);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
    }
    lVar11 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
    size = index->fNElements;
    if ((size == (int)lVar11) &&
       ((B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow == size)) {
      local_50 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
      if (local_50 < 1) {
        return 1;
      }
      local_58 = (lVar11 << 0x20) + -0x100000000 >> 0x20;
      local_60 = local_58 * 0x10 + 0x10;
      local_48 = 0;
      local_a0 = 0;
      local_68 = B;
      do {
        TPZVec<long_double>::TPZVec(&local_88,size);
        if (0 < size) {
          lVar11 = (B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
          lVar14 = 0;
          lVar13 = size;
          do {
            lVar10 = (long)*(int *)((long)index->fStore + lVar14);
            if ((lVar11 <= lVar10 || lVar10 < 0) ||
               ((B->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= local_a0)) {
              Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *(longdouble *)((long)local_88.fStore + lVar14 * 4) =
                 B->fElem[lVar11 * local_a0 + lVar10];
            lVar14 = lVar14 + 4;
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
          if (0 < size) {
            lVar11 = 0;
            do {
              if (lVar11 == 0) {
                lVar16 = (longdouble)0;
              }
              else {
                lVar14 = 0;
                lVar16 = (longdouble)0;
                lVar13 = 0;
                lVar15 = in_ST0;
                lVar3 = in_ST1;
                lVar4 = in_ST2;
                lVar5 = in_ST3;
                lVar6 = in_ST4;
                lVar7 = in_ST5;
                in_ST5 = in_ST6;
                do {
                  in_ST4 = lVar7;
                  in_ST3 = lVar6;
                  in_ST2 = lVar5;
                  in_ST1 = lVar4;
                  in_ST0 = lVar3;
                  (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                    _vptr_TPZSavable[0x21])(this,lVar11,lVar13);
                  lVar16 = lVar16 + *(longdouble *)((long)local_88.fStore + lVar14) * lVar15;
                  lVar13 = lVar13 + 1;
                  lVar14 = lVar14 + 0x10;
                  lVar15 = in_ST0;
                  lVar3 = in_ST1;
                  lVar4 = in_ST2;
                  lVar5 = in_ST3;
                  lVar6 = in_ST4;
                  lVar7 = in_ST5;
                } while (lVar11 != lVar13);
              }
              local_88.fStore[lVar11] = local_88.fStore[lVar11] - lVar16;
              lVar11 = lVar11 + 1;
              in_ST6 = in_ST5;
            } while (lVar11 != size);
          }
        }
        lVar11 = local_60;
        lVar13 = local_58;
        lVar16 = in_ST0;
        lVar15 = in_ST1;
        lVar3 = in_ST2;
        lVar4 = in_ST3;
        lVar5 = in_ST4;
        if (-1 < local_58) {
          do {
            in_ST4 = in_ST5;
            in_ST3 = lVar5;
            in_ST2 = lVar4;
            in_ST1 = lVar3;
            in_ST0 = lVar15;
            lVar14 = lVar13 + 1;
            if (lVar14 < size) {
              local_ac = (longdouble)0;
              lVar10 = lVar11;
              lVar15 = lVar16;
              lVar3 = in_ST0;
              lVar4 = in_ST1;
              lVar5 = in_ST2;
              lVar6 = in_ST3;
              lVar7 = in_ST4;
              in_ST4 = in_ST6;
              do {
                in_ST3 = lVar7;
                in_ST2 = lVar6;
                in_ST1 = lVar5;
                in_ST0 = lVar4;
                lVar16 = lVar3;
                (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
                  _vptr_TPZSavable[0x21])(this,lVar13,lVar14);
                local_ac = local_ac + *(longdouble *)((long)local_88.fStore + lVar10) * lVar15;
                lVar14 = lVar14 + 1;
                lVar10 = lVar10 + 0x10;
                lVar15 = lVar16;
                lVar3 = in_ST0;
                lVar4 = in_ST1;
                lVar5 = in_ST2;
                lVar6 = in_ST3;
                lVar7 = in_ST4;
              } while (lVar14 < size);
            }
            else {
              local_ac = (longdouble)0;
            }
            local_3c = local_88.fStore[lVar13];
            (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x21])(this,lVar13,lVar13);
            local_88.fStore[lVar13] = (local_3c - local_ac) / lVar16;
            lVar11 = lVar11 + -0x10;
            bVar2 = 0 < lVar13;
            lVar13 = lVar13 + -1;
            lVar16 = in_ST0;
            lVar15 = in_ST1;
            lVar3 = in_ST2;
            lVar4 = in_ST3;
            lVar5 = in_ST4;
            in_ST5 = in_ST4;
            in_ST6 = in_ST4;
          } while (bVar2);
        }
        lVar11 = local_48;
        B = local_68;
        if (0 < size) {
          lVar13 = (local_68->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
          lVar10 = 0;
          lVar14 = 0;
          do {
            if ((lVar13 <= lVar14) ||
               ((local_68->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= local_a0)) {
              Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *(unkbyte10 *)((long)local_68->fElem + lVar10 + local_48 * lVar13) =
                 *(unkbyte10 *)((long)local_88.fStore + lVar10);
            lVar14 = lVar14 + 1;
            lVar10 = lVar10 + 0x10;
          } while (size != lVar14);
        }
        local_88._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813e70;
        if (local_88.fStore != (longdouble *)0x0) {
          operator_delete__(local_88.fStore);
        }
        local_a0 = local_a0 + 1;
        local_48 = lVar11 + 0x10;
      } while (local_a0 != local_50);
      return 1;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,anon_var_dwarf_3563f2,0x43);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"this->fIndex = ",0xf);
    poVar8 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  b = ",6);
    plVar9 = (long *)std::ostream::_M_insert<long>((long)poVar8);
  }
  std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
  std::ostream::put((char)plVar9);
  std::ostream::flush();
  return 0;
}

Assistant:

int TPZFMatrix<TVar>::Substitution( TPZFMatrix<TVar> *B, const TPZVec<int> &index ) const{
    
    if(!B){
        PZError << __PRETTY_FUNCTION__ << "TPZFMatrix<>*B eh nulo" << endl;
        return 0;
    }
    
    TPZFMatrix<TVar> &b = *B;
    
    if (!this->fDecomposed){
        PZError <<  __PRETTY_FUNCTION__ << "Matriz não decomposta" << endl;
        return 0;
    }
    
    if (this->fDecomposed != ELUPivot){
        PZError << __PRETTY_FUNCTION__ << "\nfDecomposed != ELUPivot" << endl;
    }
    
    int nRows = this->Rows();
    
    if (index.NElements() != nRows || b.Rows() != nRows)
    {
        cout << "TMatrix::Substituicao ERRO : vetores com dimensões incompativeis:\n"
        << "this->fIndex = " << index.NElements() << "  b = " << b.Rows() << endl;
        return 0;
    }
    
    int64_t ncols = B->Cols();
    for(int64_t ic = 0; ic<ncols; ic++)
    {
        int64_t i,j;
        TVar sum = 0;
        
        TPZVec<TVar> v(nRows);
        
        
        for (i=0;i<nRows;i++)
        {
            v[i] = b(index[i],ic);
        }
        
        //Ly=b
        for (i=0;i<nRows;i++)
        {
            sum = 0.;
            for (j=0;j<(i);j++) sum +=this->Get(i,j) * v[j];
            v[i] -= sum;
        }
        
        //Ux=y
        for (i=(nRows-1);i>-1;i--)
        {
            sum = 0.;
            for (j=(i+1);j<nRows;j++) sum += this->Get(i,j) * v[j];
            v[i] = (v[i] - sum) / this->Get(i,i);
        }
        
        for (i=0;i<nRows;i++) b(i,ic) = v[i];
    }
    return 1;
}